

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void YUY2ToUV422Row_SSE2(uint8_t *src_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [15];
  byte bVar15;
  int iVar16;
  long lVar17;
  ushort uVar18;
  ushort uVar26;
  undefined4 uVar19;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_yuy2_local;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  undefined6 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [16];
  
  lVar17 = (long)dst_v - (long)dst_u;
  do {
    auVar25 = *(undefined1 (*) [16])src_yuy2;
    auVar1 = *(undefined1 (*) [16])((long)src_yuy2 + 0x10);
    src_yuy2 = (uint8_t *)((long)src_yuy2 + 0x20);
    uVar18 = auVar25._0_2_ >> 8;
    uVar26 = auVar25._2_2_ >> 8;
    uVar27 = auVar25._4_2_ >> 8;
    uVar28 = auVar25._6_2_ >> 8;
    uVar29 = auVar25._8_2_ >> 8;
    uVar30 = auVar25._10_2_ >> 8;
    uVar31 = auVar25._12_2_ >> 8;
    uVar32 = auVar25._14_2_ >> 8;
    uVar33 = auVar1._0_2_ >> 8;
    uVar34 = auVar1._2_2_ >> 8;
    uVar35 = auVar1._4_2_ >> 8;
    uVar36 = auVar1._6_2_ >> 8;
    uVar37 = auVar1._8_2_ >> 8;
    uVar38 = auVar1._10_2_ >> 8;
    uVar39 = auVar1._12_2_ >> 8;
    uVar40 = auVar1._14_2_ >> 8;
    bVar3 = (uVar26 != 0) * (uVar26 < 0x100) * auVar25[3] - (0xff < uVar26);
    cVar4 = (uVar28 != 0) * (uVar28 < 0x100) * auVar25[7] - (0xff < uVar28);
    uVar19 = CONCAT13(cVar4,CONCAT12((uVar27 != 0) * (uVar27 < 0x100) * auVar25[5] - (0xff < uVar27)
                                     ,CONCAT11(bVar3,(uVar18 != 0) * (uVar18 < 0x100) * auVar25[1] -
                                                     (0xff < uVar18))));
    cVar5 = (uVar30 != 0) * (uVar30 < 0x100) * auVar25[0xb] - (0xff < uVar30);
    uVar20 = CONCAT15(cVar5,CONCAT14((uVar29 != 0) * (uVar29 < 0x100) * auVar25[9] - (0xff < uVar29)
                                     ,uVar19));
    cVar6 = (uVar32 != 0) * (uVar32 < 0x100) * auVar25[0xf] - (0xff < uVar32);
    uVar21 = CONCAT17(cVar6,CONCAT16((uVar31 != 0) * (uVar31 < 0x100) * auVar25[0xd] -
                                     (0xff < uVar31),uVar20));
    cVar7 = (uVar34 != 0) * (uVar34 < 0x100) * auVar1[3] - (0xff < uVar34);
    auVar22._0_10_ =
         CONCAT19(cVar7,CONCAT18((uVar33 != 0) * (uVar33 < 0x100) * auVar1[1] - (0xff < uVar33),
                                 uVar21));
    auVar22[10] = (uVar35 != 0) * (uVar35 < 0x100) * auVar1[5] - (0xff < uVar35);
    cVar8 = (uVar36 != 0) * (uVar36 < 0x100) * auVar1[7] - (0xff < uVar36);
    auVar22[0xb] = cVar8;
    auVar23[0xc] = (uVar37 != 0) * (uVar37 < 0x100) * auVar1[9] - (0xff < uVar37);
    auVar23._0_12_ = auVar22;
    cVar9 = (uVar38 != 0) * (uVar38 < 0x100) * auVar1[0xb] - (0xff < uVar38);
    auVar23[0xd] = cVar9;
    auVar24[0xe] = (uVar39 != 0) * (uVar39 < 0x100) * auVar1[0xd] - (0xff < uVar39);
    auVar24._0_14_ = auVar23;
    cVar10 = (uVar40 != 0) * (uVar40 < 0x100) * auVar1[0xf] - (0xff < uVar40);
    auVar25[0xf] = cVar10;
    auVar25._0_15_ = auVar24;
    auVar14[8] = 0xff;
    auVar14._0_8_ = 0xff00ff00ff00ff;
    auVar14[9] = 0;
    auVar14[10] = 0xff;
    auVar14[0xb] = 0;
    auVar14[0xc] = 0xff;
    auVar14[0xd] = 0;
    auVar14[0xe] = 0xff;
    auVar24 = auVar24 & auVar14;
    uVar18 = auVar24._0_2_;
    uVar26 = auVar24._2_2_;
    uVar27 = auVar24._4_2_;
    uVar28 = auVar24._6_2_;
    sVar11 = auVar24._8_2_;
    sVar12 = auVar24._10_2_;
    sVar13 = auVar24._12_2_;
    bVar15 = auVar24[0xe];
    uVar29 = (ushort)bVar3;
    uVar30 = (ushort)((uint)uVar19 >> 0x18);
    uVar31 = (ushort)((uint6)uVar20 >> 0x28);
    uVar32 = (ushort)((ulong)uVar21 >> 0x38);
    uVar33 = (ushort)((unkuint10)auVar22._0_10_ >> 0x48);
    uVar34 = auVar22._10_2_ >> 8;
    uVar35 = auVar23._12_2_ >> 8;
    uVar36 = auVar25._14_2_ >> 8;
    *(ulong *)dst_u =
         CONCAT17((bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15),
                  CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar24[0xc] - (0xff < sVar13),
                           CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar24[10] - (0xff < sVar12),
                                    CONCAT14((0 < sVar11) * (sVar11 < 0x100) * auVar24[8] -
                                             (0xff < sVar11),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) * auVar24[6]
                                                      - (0xff < uVar28),
                                                      CONCAT12((uVar27 != 0) * (uVar27 < 0x100) *
                                                               auVar24[4] - (0xff < uVar27),
                                                               CONCAT11((uVar26 != 0) *
                                                                        (uVar26 < 0x100) *
                                                                        auVar24[2] - (0xff < uVar26)
                                                                        ,(uVar18 != 0) *
                                                                         (uVar18 < 0x100) *
                                                                         auVar24[0] -
                                                                         (0xff < uVar18))))))));
    *(ulong *)(dst_u + lVar17) =
         CONCAT17((uVar36 != 0) * (uVar36 < 0x100) * cVar10 - (0xff < uVar36),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * cVar9 - (0xff < uVar35),
                           CONCAT15((uVar34 != 0) * (uVar34 < 0x100) * cVar8 - (0xff < uVar34),
                                    CONCAT14((uVar33 != 0) * (uVar33 < 0x100) * cVar7 -
                                             (0xff < uVar33),
                                             CONCAT13((uVar32 != 0) * (uVar32 < 0x100) * cVar6 -
                                                      (0xff < uVar32),
                                                      CONCAT12((uVar31 != 0) * (uVar31 < 0x100) *
                                                               cVar5 - (0xff < uVar31),
                                                               CONCAT11((uVar30 != 0) *
                                                                        (uVar30 < 0x100) * cVar4 -
                                                                        (0xff < uVar30),
                                                                        (uVar29 != 0) *
                                                                        (uVar29 < 0x100) * bVar3 -
                                                                        (0xff < uVar29))))))));
    dst_u = dst_u + 8;
    iVar16 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar16;
  } while (iVar16 != 0 && bVar2);
  return;
}

Assistant:

void YUY2ToUV422Row_SSE2(const uint8_t* src_yuy2,
                         uint8_t* dst_u,
                         uint8_t* dst_v,
                         int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "psrlw       $0x8,%%xmm5                   \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "psrlw       $0x8,%%xmm0                   \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pand        %%xmm5,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "psrlw       $0x8,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movq        %%xmm1,0x00(%1,%2,1)          \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_yuy2),  // %0
        "+r"(dst_u),     // %1
        "+r"(dst_v),     // %2
        "+r"(width)      // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}